

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_sign.c
# Opt level: O0

int crypto_sign_open(uchar *m,unsigned_long_long *mlen,uchar *sm,unsigned_long_long smlen,uchar *pk)

{
  size_t __n;
  ulong in_RCX;
  __uint32_t *in_RDX;
  size_t *in_RSI;
  void *in_RDI;
  char *in_R8;
  uint8_t *sig;
  uint8_t *message;
  size_t message_len;
  int ret;
  picnic_publickey_t ppk;
  uint32_t signature_len;
  undefined1 local_75 [65];
  __uint32_t local_34;
  char *local_30;
  ulong local_28;
  __uint32_t *local_20;
  size_t *local_18;
  void *local_10;
  int local_4;
  
  if (*in_R8 == '\x04') {
    if (in_RCX < 4) {
      local_4 = -2;
    }
    else {
      local_34 = *in_RDX;
      local_30 = in_R8;
      local_28 = in_RCX;
      local_20 = in_RDX;
      local_18 = in_RSI;
      local_10 = in_RDI;
      local_34 = __uint32_identity(local_34);
      if (local_28 < (ulong)local_34 + 4) {
        local_4 = -2;
      }
      else {
        local_4 = picnic_read_public_key(local_75,local_30,0x31);
        if (-1 < local_4) {
          __n = (local_28 - local_34) - 4;
          local_4 = picnic_verify(local_75,local_20 + 1,__n,(long)local_20 + (local_28 - local_34),
                                  local_34);
          if (local_4 == 0) {
            memmove(local_10,local_20 + 1,__n);
            *local_18 = __n;
            local_4 = 0;
          }
        }
      }
    }
  }
  else {
    local_4 = -3;
  }
  return local_4;
}

Assistant:

int crypto_sign_open(unsigned char* m, unsigned long long* mlen, const unsigned char* sm,
                     unsigned long long smlen, const unsigned char* pk) {
  if (pk[0] != Picnic_L3_UR) {
    return -3;
  }

  uint32_t signature_len = 0;
  // The signature is too short to hold the signature length.
  if (smlen < sizeof(signature_len)) {
    return -2;
  }

  memcpy(&signature_len, sm, sizeof(signature_len));
  signature_len = le32toh(signature_len);
  // The signature is too short to hold the signature
  if (signature_len + sizeof(signature_len) > smlen) {
    return -2;
  }

  picnic_publickey_t ppk;
  int ret = picnic_read_public_key(&ppk, pk, PICNIC_PUBLIC_KEY_SIZE(Picnic_L3_UR));
  if (ret < 0) {
    return ret;
  }

  const size_t message_len = smlen - signature_len - sizeof(signature_len);
  const uint8_t* message   = sm + sizeof(signature_len);
  const uint8_t* sig       = sm + sizeof(signature_len) + message_len;

  ret = picnic_verify(&ppk, message, message_len, sig, signature_len);
  if (ret) {
    return ret;
  }

  // The signature is valid, so copy the message to its destination.
  memmove(m, message, message_len);
  *mlen = message_len;

  return 0;
}